

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

double * r8mat_test(char trans,int lda,int m,int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int local_28;
  int local_24;
  int j;
  int i;
  double *a;
  int n_local;
  int m_local;
  int lda_local;
  char trans_local;
  
  if (trans == 'N') {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(lda * n);
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    _j = (double *)operator_new__(uVar3);
    for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
      for (local_24 = 0; local_24 < m; local_24 = local_24 + 1) {
        _j[local_24 + local_28 * lda] = (double)((local_24 + 1) * 10 + local_28 + 1);
      }
    }
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(lda * m);
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    _j = (double *)operator_new__(uVar3);
    for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
      for (local_24 = 0; local_24 < m; local_24 = local_24 + 1) {
        _j[local_28 + local_24 * lda] = (double)((local_24 + 1) * 10 + local_28 + 1);
      }
    }
  }
  return _j;
}

Assistant:

double *r8mat_test ( char trans, int lda, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_TEST sets up a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//  
//  Modified:
//
//    10 February 2014
//
//  Author:
//
//    John Burkardt.
//
//  Parameters:
//
//    Input, char TRANS, indicates whether matrix is to be transposed.
//    'N', no transpose.
//    'T', transpose the matrix.
//
//    Input, int LDA, the leading dimension of the matrix.
//
//    Input, int M, N, the number of rows and columns of the matrix.
//
//    Output, double R8MAT_TEST[?], the matrix.
//    if TRANS is 'N', then the matrix is stored in LDA*N entries,
//    as an M x N matrix;
//    if TRANS is 'T', then the matrix is stored in LDA*M entries,
//    as an N x M matrix.
//
{
  double *a;
  int i;
  int j;

  if ( trans == 'N' )
  {
    a = new double[lda*n];

    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        a[i+j*lda] = static_cast<double> ( 10 * ( i + 1 ) + ( j + 1 ) );
      }
    }
  }
  else
  {
    a = new double[lda*m];

    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        a[j+i*lda] = static_cast<double> ( 10 * ( i + 1 ) + ( j + 1 ) );
      }
    }
  }
  return a;
}